

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Transform * __thiscall
pbrt::Transform::operator*(Transform *__return_storage_ptr__,Transform *this,Transform *t2)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  int i_1;
  Float (*paFVar3) [4];
  SquareMatrix<4> *pSVar4;
  long lVar5;
  Transform *pTVar6;
  SquareMatrix<4> *pSVar7;
  int j_1;
  Transform *pTVar8;
  int j;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  SquareMatrix<4> r_1;
  SquareMatrix<4> r;
  
  auVar1 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  paFVar3 = (Float (*) [4])&r;
  lVar5 = 0;
  do {
    auVar11 = vpbroadcastq_avx512vl();
    lVar5 = lVar5 + 1;
    uVar2 = vpcmpeqq_avx512vl(auVar11,auVar1);
    auVar13 = vpmovm2d_avx512vl(uVar2 & 0xf);
    auVar13 = vpsrld_avx(auVar13,0x1f);
    auVar13 = vcvtdq2ps_avx(auVar13);
    *paFVar3 = (Float  [4])auVar13;
    paFVar3 = paFVar3 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  pTVar6 = this;
  do {
    lVar9 = 0;
    pTVar8 = t2;
    do {
      auVar13 = ZEXT816(0) << 0x40;
      lVar10 = 0;
      do {
        auVar13 = vfmadd231ss_fma(auVar13,ZEXT416(*(uint *)((long)(pTVar6->m).m[0] + lVar10)),
                                  ZEXT416((uint)(pTVar8->m).m[0][lVar10]));
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x10);
      r.m[lVar5][lVar9] = auVar13._0_4_;
      lVar9 = lVar9 + 1;
      pTVar8 = (Transform *)((pTVar8->m).m[0] + 1);
    } while (lVar9 != 4);
    lVar5 = lVar5 + 1;
    pTVar6 = (Transform *)((pTVar6->m).m + 1);
  } while (lVar5 != 4);
  pSVar4 = &t2->mInv;
  paFVar3 = (Float (*) [4])&r_1;
  lVar5 = 0;
  do {
    auVar11 = vpbroadcastq_avx512vl();
    lVar5 = lVar5 + 1;
    uVar2 = vpcmpeqq_avx512vl(auVar11,auVar1);
    auVar13 = vpmovm2d_avx512vl(uVar2 & 0xf);
    auVar13 = vpsrld_avx(auVar13,0x1f);
    auVar13 = vcvtdq2ps_avx(auVar13);
    *paFVar3 = (Float  [4])auVar13;
    paFVar3 = paFVar3 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    lVar9 = 0;
    pSVar7 = &this->mInv;
    do {
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      lVar10 = 0;
      do {
        auVar13 = vfmadd231ss_fma(auVar12._0_16_,ZEXT416(*(uint *)((long)pSVar4->m[0] + lVar10)),
                                  ZEXT416((uint)pSVar7->m[0][lVar10]));
        auVar12 = ZEXT1664(auVar13);
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x10);
      r_1.m[lVar5][lVar9] = auVar13._0_4_;
      lVar9 = lVar9 + 1;
      pSVar7 = (SquareMatrix<4> *)(pSVar7->m[0] + 1);
    } while (lVar9 != 4);
    lVar5 = lVar5 + 1;
    pSVar4 = (SquareMatrix<4> *)(pSVar4->m + 1);
  } while (lVar5 != 4);
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = r.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = r.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = r.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = r.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = r.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = r.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = r.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = r.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = r_1.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = r_1.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = r_1.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = r_1.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = r_1.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = r_1.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = r_1.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = r_1.m[3]._8_8_;
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::operator*(const Transform &t2) const {
    return Transform(m * t2.m, t2.mInv * mInv);
}